

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Glucose::SimpSolver::backwardSubsumptionCheck(SimpSolver *this,bool verbose)

{
  Clause *this_00;
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  bool bVar4;
  int iVar5;
  Lit LVar6;
  vec<unsigned_int> *pvVar7;
  int iVar8;
  ulong uVar10;
  long lVar11;
  int iVar12;
  undefined7 in_register_00000031;
  ulong uVar13;
  int iVar14;
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *this_01;
  Var best;
  uint local_68;
  uint local_64;
  ulong local_60;
  ulong local_58;
  vec<unsigned_int> *local_50;
  undefined4 local_44;
  Queue<unsigned_int> *local_40;
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *local_38;
  int iVar9;
  
  local_44 = (undefined4)CONCAT71(in_register_00000031,verbose);
  local_40 = &this->subsumption_queue;
  local_38 = &this->occurs;
  local_68 = 0;
  local_64 = 0;
  local_58 = 0;
  this_01 = local_38;
  while( true ) {
    iVar8 = (this->subsumption_queue).end;
    iVar14 = (this->subsumption_queue).buf.sz;
    iVar5 = (this->subsumption_queue).first;
    iVar12 = iVar8 - iVar5;
    iVar9 = 0;
    if (iVar8 < iVar5) {
      iVar9 = iVar14;
    }
    iVar8 = iVar9 + iVar12;
    if ((iVar8 == 0 || SCARRY4(iVar9,iVar12) != iVar8 < 0) &&
       ((this->super_Solver).trail.sz <= this->bwdsub_assigns)) break;
    if ((this->super_Solver).asynch_interrupt == true) {
      Queue<unsigned_int>::clear(local_40,false);
      this->bwdsub_assigns = (this->super_Solver).trail.sz;
      return true;
    }
    if (iVar8 == 0) {
      iVar8 = this->bwdsub_assigns;
      if (iVar8 < (this->super_Solver).trail.sz) {
        this->bwdsub_assigns = iVar8 + 1;
        puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
        puVar2[(ulong)this->bwdsub_tmpunit + 3] = (this->super_Solver).trail.data[iVar8].x;
        Clause::calcAbstraction((Clause *)(puVar2 + this->bwdsub_tmpunit));
        Queue<unsigned_int>::insert(local_40,this->bwdsub_tmpunit);
        iVar14 = (this->subsumption_queue).buf.sz;
        iVar5 = (this->subsumption_queue).first;
      }
    }
    uVar10 = (ulong)(this->subsumption_queue).buf.data[iVar5];
    iVar8 = iVar5 + 1;
    if (iVar5 + 1 == iVar14) {
      iVar8 = 0;
    }
    (this->subsumption_queue).first = iVar8;
    puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
    uVar13 = *(ulong *)(puVar2 + uVar10);
    if ((uVar13 & 3) == 0) {
      this_00 = (Clause *)(puVar2 + uVar10);
      local_60 = uVar10;
      if (((char)local_44 != '\0') && (1 < (this->super_Solver).verbosity)) {
        iVar5 = (int)local_58;
        if ((int)((long)((ulong)(uint)(iVar5 >> 0x1f) << 0x20 | local_58 & 0xffffffff) % 1000) == 0)
        {
          iVar9 = (this->subsumption_queue).end;
          if (iVar8 <= iVar9) {
            iVar14 = 0;
          }
          printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r",
                 (ulong)(uint)((iVar9 - iVar8) + iVar14),(ulong)local_64,(ulong)local_68);
          uVar13 = *(ulong *)&this_00->header;
        }
        local_58 = (ulong)(iVar5 + 1);
      }
      iVar8 = *(int *)&this_00[1].header >> 1;
      pvVar7 = (this_01->occs).data;
      best = iVar8;
      for (lVar11 = 4; lVar11 + -3 < (long)uVar13 >> 0x20; lVar11 = lVar11 + 1) {
        iVar14 = *(int *)(&(this_00->header).field_0x0 + lVar11 * 4) >> 1;
        if (pvVar7[iVar14].sz < pvVar7[iVar8].sz) {
          iVar8 = iVar14;
          best = iVar14;
        }
      }
      pvVar7 = OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::lookup
                         (this_01,&best);
      puVar2 = pvVar7->data;
      iVar8 = 0;
      uVar10 = local_60;
      local_50 = pvVar7;
      while ((this_01 = local_38, iVar8 < pvVar7->sz &&
             ((undefined1  [12])((undefined1  [12])this_00->header & (undefined1  [12])0x3) ==
              (undefined1  [12])0x0))) {
        uVar1 = puVar2[iVar8];
        if (uVar1 != (uint)uVar10) {
          puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
          uVar13 = *(ulong *)(puVar3 + uVar1);
          if (((uVar13 & 3) == 0) &&
             (((this->subsumption_lim == -1 || ((int)(uVar13 >> 0x20) < this->subsumption_lim)) &&
              (LVar6 = Clause::subsumes(this_00,(Clause *)(puVar3 + uVar1)), pvVar7 = local_50,
              uVar10 = local_60, LVar6.x != -1)))) {
            if (LVar6.x == -2) {
              local_64 = local_64 + 1;
              removeClause(this,puVar2[iVar8],false);
              pvVar7 = local_50;
              uVar10 = local_60;
            }
            else {
              bVar4 = strengthenClause(this,puVar2[iVar8],(Lit)(LVar6.x ^ 1));
              if (!bVar4) {
                return false;
              }
              local_68 = local_68 + 1;
              iVar8 = iVar8 - (uint)(LVar6.x >> 1 == best);
              pvVar7 = local_50;
              uVar10 = local_60;
            }
          }
        }
        iVar8 = iVar8 + 1;
      }
    }
  }
  return true;
}

Assistant:

bool SimpSolver::backwardSubsumptionCheck(bool verbose)
{
    int cnt = 0;
    int subsumed = 0;
    int deleted_literals = 0;
    assert(decisionLevel() == 0);

    while (subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()){

        // Empty subsumption queue and return immediately on user-interrupt:
        if (asynch_interrupt){
            subsumption_queue.clear();
            bwdsub_assigns = trail.size();
            break; }

        // Check top-level assignments by creating a dummy clause and placing it in the queue:
        if (subsumption_queue.size() == 0 && bwdsub_assigns < trail.size()){
            Lit l = trail[bwdsub_assigns++];
            ca[bwdsub_tmpunit][0] = l;
            ca[bwdsub_tmpunit].calcAbstraction();
            subsumption_queue.insert(bwdsub_tmpunit); }

        CRef    cr = subsumption_queue.peek(); subsumption_queue.pop();
        Clause& c  = ca[cr];

        if (c.mark()) continue;

        if (verbose && verbosity >= 2 && cnt++ % 1000 == 0)
            printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r", subsumption_queue.size(), subsumed, deleted_literals);

        assert(c.size() > 1 || value(c[0]) == l_True);    // Unit-clauses should have been propagated before this point.

        // Find best variable to scan:
        Var best = var(c[0]);
        for (int i = 1; i < c.size(); i++)
            if (occurs[var(c[i])].size() < occurs[best].size())
                best = var(c[i]);

        // Search all candidates:
        vec<CRef>& _cs = occurs.lookup(best);
        CRef*       cs = (CRef*)_cs;

        for (int j = 0; j < _cs.size(); j++)
            if (c.mark())
                break;
            else if (!ca[cs[j]].mark() &&  cs[j] != cr && (subsumption_lim == -1 || ca[cs[j]].size() < subsumption_lim)){
                Lit l = c.subsumes(ca[cs[j]]);

                if (l == lit_Undef)
                    subsumed++, removeClause(cs[j]);
                else if (l != lit_Error){
                    deleted_literals++;

                    if (!strengthenClause(cs[j], ~l))
                        return false;

                    // Did current candidate get deleted from cs? Then check candidate at index j again:
                    if (var(l) == best)
                        j--;
                }
            }
    }

    return true;
}